

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O1

void Shell::Shuffling::shuffleArray<Lib::DArray<Lib::List<Kernel::Unit*>*>>
               (DArray<Lib::List<Kernel::Unit_*>_*> *a,uint len)

{
  List<Kernel::Unit_*> **ppLVar1;
  List<Kernel::Unit_*> *pLVar2;
  result_type_conflict1 rVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  param_type local_38;
  
  if (len != 0) {
    uVar5 = len - 1;
    uVar6 = 0;
    do {
      local_38 = (param_type)((ulong)uVar5 << 0x20);
      rVar3 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_38,&::Lib::Random::_eng,&local_38);
      uVar4 = rVar3 + (int)uVar6;
      ppLVar1 = a->_array;
      pLVar2 = ppLVar1[uVar6];
      ppLVar1[uVar6] = ppLVar1[uVar4];
      ppLVar1[uVar4] = pLVar2;
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 - 1;
    } while (len != uVar6);
  }
  return;
}

Assistant:

static void shuffleArray(Arrayish& a, unsigned len) {
    for(unsigned i=0;i<len;i++){
      unsigned j = Random::getInteger(len-i)+i;
      std::swap(a[i],a[j]);
    }
  }